

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramCopy(VP8LHistogram *src,VP8LHistogram *dst)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int histo_size;
  int literal_size;
  int dst_cache_bits;
  uint32_t *dst_literal;
  
  uVar1 = *in_RSI;
  iVar3 = *(int *)(in_RSI + 0x195);
  iVar2 = VP8LHistogramNumCodes(iVar3);
  iVar3 = VP8LGetHistogramSize(iVar3);
  memcpy(in_RSI,in_RDI,(long)iVar3);
  *in_RSI = uVar1;
  memcpy((void *)*in_RSI,(void *)*in_RDI,(long)iVar2 << 2);
  return;
}

Assistant:

static void HistogramCopy(const VP8LHistogram* const src,
                          VP8LHistogram* const dst) {
  uint32_t* const dst_literal = dst->literal_;
  const int dst_cache_bits = dst->palette_code_bits_;
  const int literal_size = VP8LHistogramNumCodes(dst_cache_bits);
  const int histo_size = VP8LGetHistogramSize(dst_cache_bits);
  assert(src->palette_code_bits_ == dst_cache_bits);
  memcpy(dst, src, histo_size);
  dst->literal_ = dst_literal;
  memcpy(dst->literal_, src->literal_, literal_size * sizeof(*dst->literal_));
}